

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::GetCurrentExecutableDirectory_abi_cxx11_(void)

{
  string *psVar1;
  string *in_RDI;
  FilePath *in_stack_00000008;
  FilePath argv_0;
  FilePath *in_stack_ffffffffffffff90;
  string local_40 [2];
  
  psVar1 = local_40;
  internal::GetArgvs_abi_cxx11_();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)psVar1,0);
  internal::FilePath::FilePath(in_stack_ffffffffffffff90,psVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffff90);
  internal::FilePath::RemoveFileName(in_stack_00000008);
  psVar1 = internal::FilePath::string_abi_cxx11_((FilePath *)&stack0xffffffffffffff90);
  std::__cxx11::string::string((string *)in_RDI,(string *)psVar1);
  internal::FilePath::~FilePath((FilePath *)0x21bb14);
  internal::FilePath::~FilePath((FilePath *)0x21bb1e);
  return in_RDI;
}

Assistant:

static std::string GetCurrentExecutableDirectory() {
  internal::FilePath argv_0(internal::GetArgvs()[0]);
  return argv_0.RemoveFileName().string();
}